

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::flipshpush(tetgenmesh *this,face *flipedge)

{
  int iVar1;
  shellface *pppdVar2;
  badface *pbVar3;
  
  pbVar3 = (badface *)memorypool::alloc(this->flippool);
  pppdVar2 = flipedge->sh;
  (pbVar3->ss).sh = pppdVar2;
  iVar1 = flipedge->shver;
  (pbVar3->ss).shver = iVar1;
  pbVar3->forg = (point)pppdVar2[sorgpivot[iVar1]];
  pbVar3->fdest = (point)pppdVar2[sdestpivot[iVar1]];
  pbVar3->nextitem = this->flipstack;
  this->flipstack = pbVar3;
  return;
}

Assistant:

void tetgenmesh::flipshpush(face* flipedge)
{
  badface *newflipface;

  newflipface = (badface *) flippool->alloc();
  newflipface->ss = *flipedge;
  newflipface->forg = sorg(*flipedge);
  newflipface->fdest = sdest(*flipedge);
  newflipface->nextitem = flipstack;
  flipstack = newflipface;
}